

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O3

int32_t pool_sync2(ProcPool *pool)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  int32_t i;
  long lVar7;
  bool bVar8;
  char **ppcVar9;
  Process *__s;
  int exit_status;
  int local_3c;
  char **local_38;
  
  local_38 = pool->procs[0].args;
  bVar1 = false;
  do {
    bVar8 = bVar1;
    iVar3 = pool->max_num_procs;
    if (0 < iVar3) {
      lVar6 = 0;
      ppcVar9 = local_38;
      do {
        if (pool->procs[lVar6].valid == true) {
          __s = pool->procs + lVar6;
          if (pool->aborted == true) {
            kill(__s->pid,0xf);
          }
          local_3c = 0;
          _Var2 = proc_terminated(__s->pid,&local_3c);
          if (_Var2) {
            pcVar5 = "failed";
            if (local_3c == 0) {
              pcVar5 = "exited correctly";
            }
            local_38 = (char **)CONCAT44(local_38._4_4_,local_3c);
            printf("Process %d %s [status=%d]: ",(ulong)(uint)__s->pid,pcVar5);
            printf("(CMD");
            lVar7 = 0;
            goto LAB_00102c10;
          }
          iVar3 = pool->max_num_procs;
          bVar8 = true;
        }
        lVar6 = lVar6 + 1;
        iVar4 = 0x10;
        if (iVar3 < 0x10) {
          iVar4 = iVar3;
        }
        ppcVar9 = ppcVar9 + 0x102;
      } while (lVar6 < iVar4);
    }
    usleep(10000);
    bVar1 = true;
  } while (bVar8);
  lVar6 = 0x80000000;
  goto LAB_00102c81;
  while( true ) {
    printf(" %s");
    lVar7 = lVar7 + 1;
    if (lVar7 == 0xff) break;
LAB_00102c10:
    if (ppcVar9[lVar7] == (char *)0x0) break;
  }
  puts(")");
  if (pool->on_async_proc_exit != (_func_void_Process_ptr_int_void_ptr *)0x0) {
    (*pool->on_async_proc_exit)(__s,(int)local_38,__s->user_handle);
  }
  __s->pid = -0x80000000;
  lVar7 = 0x100;
  do {
    free(*ppcVar9);
    ppcVar9 = ppcVar9 + 1;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  memset(__s,0,0x810);
LAB_00102c81:
  return (int32_t)lVar6;
}

Assistant:

static int32_t pool_sync2(ProcPool *pool) {
    bool any_valid = false;
    do {
        for (int32_t idx = 0; idx < MIN(pool->max_num_procs, PROC_POOL_SIZE);
             idx++) {
            Process *p = &pool->procs[idx];
            if (!p->valid) {
                continue;
            } else {
                any_valid = true;
            }

            if (pool->aborted) {
                assert(p->valid);

                // Kill it hard, we don't want CPTP to generate a suboptimal
                // solution in its JSON output
                kill(p->pid, SIGTERM);
            }

            int exit_status = 0;
            if (proc_terminated(p->pid, &exit_status)) {
                printf("Process %d %s [status=%d]: ", p->pid,
                       exit_status == 0 ? "exited correctly" : "failed",
                       exit_status);
                printf("(CMD");

                for (int32_t i = 0; i < PROC_MAX_ARGS - 1 && p->args[i] != NULL;
                     i++) {
                    printf(" %s", p->args[i]);
                }
                printf(")\n");
                if (pool->on_async_proc_exit) {
                    pool->on_async_proc_exit(p, exit_status, p->user_handle);
                }
                proc_destroy(p);
                return idx;
            }
        }
        usleep(PROC_POOL_UPDATE_PERIOD_MSEC * 1000);
    } while (any_valid);

    return INT32_MIN;
}